

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpSocket.cpp
# Opt level: O2

void __thiscall mognetwork::TcpSocket::TcpSocket(TcpSocket *this)

{
  Socket::Socket(&this->super_Socket,Tcp);
  (this->super_Socket)._vptr_Socket = (_func_int **)&PTR__TcpSocket_00114c98;
  (this->m_pendingDatas).
  super__List_base<std::vector<char,_std::allocator<char>_>_*,_std::allocator<std::vector<char,_std::allocator<char>_>_*>_>
  ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&this->m_pendingDatas;
  (this->m_pendingDatas).
  super__List_base<std::vector<char,_std::allocator<char>_>_*,_std::allocator<std::vector<char,_std::allocator<char>_>_*>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&this->m_pendingDatas;
  (this->m_pendingDatas).
  super__List_base<std::vector<char,_std::allocator<char>_>_*,_std::allocator<std::vector<char,_std::allocator<char>_>_*>_>
  ._M_impl._M_node._M_size = 0;
  ReadedDatas::ReadedDatas(&this->m_pendingRDatas);
  this->m_userData = (void *)0x0;
  Mutex::Mutex(&this->m_mutex);
  Socket::create(&this->super_Socket);
  return;
}

Assistant:

TcpSocket::TcpSocket() :
    Socket(Tcp), m_userData(NULL)
  {
    // Create the socket, and init it
    create();
  }